

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.h
# Opt level: O1

ConfigKey * ConfigKey::merge_max_datasets(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConfigKey *in_RDI;
  pointer local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"merge_max_datasets","");
  paVar1 = &(in_RDI->key_).field_2;
  (in_RDI->key_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(in_RDI->key_).field_2 + 8) = uStack_20;
  }
  else {
    (in_RDI->key_)._M_dataplus._M_p = local_38;
    (in_RDI->key_).field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  (in_RDI->key_)._M_string_length = local_30;
  in_RDI->defval_ = 10;
  in_RDI->min_ = 1;
  in_RDI->max_ = 0x400;
  return in_RDI;
}

Assistant:

const static ConfigKey merge_max_datasets() {
        return ConfigKey("merge_max_datasets", 10, 1, 1024);
    }